

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> * __thiscall
Lib::OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs>::operator=
          (OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,
          OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *other)

{
  byte *in_RSI;
  OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *in_RDI;
  MaybeUninit<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this_00;
  EVP_PKEY_CTX local_40 [48];
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x463dd7);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x463ddf);
  }
  if ((*local_10 & 1) != 0) {
    this_00 = &in_RDI->_elem;
    unwrap((OptionBase<Inferences::ALASCA::BinaryResolutionConf::Lhs> *)0x463e00);
    move_if_value<Inferences::ALASCA::BinaryResolutionConf::Lhs,_true>((Lhs *)this_00);
    MaybeUninit<Inferences::ALASCA::BinaryResolutionConf::Lhs>::init(this_00,local_40);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x463e2c);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }